

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O0

int canvas_undo_isdirty(_glist *x)

{
  int iVar1;
  _glist *x_00;
  bool local_22;
  bool local_21;
  _undo *local_20;
  _undo *udo;
  _glist *x_local;
  
  if (x == (_glist *)0x0) {
    local_20 = (_undo *)0x0;
  }
  else {
    local_20 = canvas_undo_get(x);
  }
  local_21 = false;
  if (local_20 != (_undo *)0x0) {
    local_22 = true;
    if (local_20->u_last == (_undo_action *)local_20->u_cleanstate) {
      x_00 = canvas_getrootfor(x);
      iVar1 = canvas_undo_doisdirty(x_00);
      local_22 = iVar1 != 0;
    }
    local_21 = local_22;
  }
  return (int)local_21;
}

Assistant:

static int canvas_undo_isdirty(t_canvas *x)
{
    t_undo *udo = x?canvas_undo_get(x):0;
    return (0 != udo)
        && ((udo->u_last != udo->u_cleanstate)
            || canvas_undo_doisdirty(canvas_getrootfor(x)));
}